

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_643cf::SwiftCompilerShellCommand::getVerboseDescription
          (SwiftCompilerShellCommand *this,SmallVectorImpl<char> *result)

{
  char *__s;
  pointer pSVar1;
  bool bVar2;
  void *pvVar3;
  raw_ostream *prVar4;
  StringRef *arg;
  pointer pSVar5;
  StringRef SVar6;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> commandLine;
  raw_svector_ostream os;
  SmallString<64U> outputFileMapPath;
  
  outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorStorage<char,_64U>;
  outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x40;
  getOutputFileMapPath(this,(SmallVectorImpl<char> *)&outputFileMapPath);
  commandLine.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commandLine.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLine.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  SVar6.Length._0_4_ =
       outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size;
  SVar6.Data = (char *)outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
                       super_SmallVectorTemplateBase<char,_true>.
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  SVar6.Length._4_4_ = 0;
  constructCommandLineArgs(this,SVar6,&commandLine);
  llvm::raw_svector_ostream::raw_svector_ostream(&os,result);
  pSVar1 = commandLine.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
           .super__Vector_impl_data._M_finish;
  bVar2 = true;
  pSVar5 = commandLine.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
           .super__Vector_impl_data._M_start;
  do {
    if (pSVar5 == pSVar1) {
      llvm::raw_ostream::~raw_ostream((raw_ostream *)&os);
      std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
                (&commandLine.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)
      ;
      llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&outputFileMapPath);
      return;
    }
    if (!bVar2) {
      llvm::raw_ostream::operator<<((raw_ostream *)&os," ");
    }
    __s = pSVar5->Data;
    SVar6 = *pSVar5;
    if (pSVar5->Length == 0) {
LAB_0011cbf9:
      llvm::raw_ostream::operator<<((raw_ostream *)&os,SVar6);
    }
    else {
      pvVar3 = memchr(__s,0x20,pSVar5->Length);
      if ((long)pvVar3 - (long)__s == -1 || pvVar3 == (void *)0x0) goto LAB_0011cbf9;
      prVar4 = llvm::raw_ostream::operator<<((raw_ostream *)&os,'\"');
      prVar4 = llvm::raw_ostream::operator<<(prVar4,*pSVar5);
      llvm::raw_ostream::operator<<(prVar4,'\"');
    }
    pSVar5 = pSVar5 + 1;
    bVar2 = false;
  } while( true );
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    SmallString<64> outputFileMapPath;
    getOutputFileMapPath(outputFileMapPath);
    
    std::vector<StringRef> commandLine;
    constructCommandLineArgs(outputFileMapPath, commandLine);
    
    llvm::raw_svector_ostream os(result);
    bool first = true;
    for (const auto& arg: commandLine) {
      if (!first) os << " ";
      first = false;
      // FIXME: This isn't correct, we need utilities for doing shell quoting.
      if (arg.find(' ') != StringRef::npos) {
        os << '"' << arg << '"';
      } else {
        os << arg;
      }
    }
  }